

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O0

int __thiscall ncnn::Scale::forward_inplace(Scale *this,Mat *bottom_top_blob)

{
  int iVar1;
  Mat *m;
  Mat *in_RSI;
  allocator_type *in_RDI;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_top_blobs;
  Mat *in_stack_ffffffffffffffa0;
  undefined1 *__n;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_ffffffffffffffc0;
  undefined1 local_29;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_28;
  Mat *local_10;
  
  __n = &local_29;
  local_10 = in_RSI;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x12b307);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_stack_ffffffffffffffc0,(size_type)__n,in_RDI);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x12b327);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_28,0);
  Mat::operator=(local_10,in_stack_ffffffffffffffa0);
  m = (Mat *)(in_RDI + 0x88);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_28,1);
  Mat::operator=(local_10,m);
  iVar1 = (**(code **)(*(long *)in_RDI + 0x30))(in_RDI,&local_28);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RDI);
  return iVar1;
}

Assistant:

int Scale::forward_inplace(Mat& bottom_top_blob) const
{
    std::vector<Mat> bottom_top_blobs(2);
    bottom_top_blobs[0] = bottom_top_blob;
    bottom_top_blobs[1] = scale_data;

    return forward_inplace(bottom_top_blobs);
}